

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

void Fra_ImpCompactArray(Vec_Int_t *vImps)

{
  int Entry;
  int i;
  int i_00;
  
  i_00 = 0;
  for (i = 0; i < vImps->nSize; i = i + 1) {
    Entry = Vec_IntEntry(vImps,i);
    if (Entry != 0) {
      Vec_IntWriteEntry(vImps,i_00,Entry);
      i_00 = i_00 + 1;
    }
  }
  if (i_00 <= vImps->nSize) {
    vImps->nSize = i_00;
    return;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

void Fra_ImpCompactArray( Vec_Int_t * vImps )
{
    int i, k, Imp;
    k = 0;
    Vec_IntForEachEntry( vImps, Imp, i )
        if ( Imp )
            Vec_IntWriteEntry( vImps, k++, Imp );
    Vec_IntShrink( vImps, k );
}